

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_next(lua_State *L,Table *t,StkId key)

{
  Value *pVVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  Value VVar6;
  Node *pNVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  TValue *io;
  
  if (key->tt_ == 0x13) {
    VVar6 = key->value_;
    if (((code *)0xffffffff7fffffff < VVar6.f + -0x80000001) &&
       (uVar9 = (ulong)t->sizearray, (uint)VVar6.b <= t->sizearray)) goto LAB_001176b6;
  }
  else if (key->tt_ == 0) {
    uVar9 = (ulong)t->sizearray;
    VVar6.gc = (GCObject *)0x0;
    goto LAB_001176b6;
  }
  pNVar7 = mainposition(t,key);
  while( true ) {
    iVar5 = luaV_equalobj((lua_State *)0x0,&(pNVar7->i_key).tvk,key);
    if ((iVar5 != 0) ||
       ((((pNVar7->i_key).nk.tt_ == 10 && ((key->tt_ & 0x40) != 0)) &&
        ((pNVar7->i_key).nk.value_.gc == (key->value_).gc)))) break;
    lVar8 = (long)(pNVar7->i_key).nk.next;
    if (lVar8 == 0) {
      luaG_runerror(L,"invalid key to \'next\'");
    }
    pNVar7 = pNVar7 + lVar8;
  }
  uVar9 = (ulong)t->sizearray;
  VVar6._0_4_ = t->sizearray + (int)((ulong)((long)pNVar7 - (long)t->node) >> 5) + 1;
  VVar6.i._4_4_ = 0;
LAB_001176b6:
  uVar12 = VVar6.i & 0xffffffff;
  lVar8 = uVar12 << 4;
  do {
    lVar10 = lVar8;
    if (uVar9 <= uVar12) {
      uVar4 = (int)uVar12 - (int)uVar9;
      do {
        uVar11 = uVar4;
        if (1 << (t->lsizenode & 0x1f) <= (int)uVar11) {
          return 0;
        }
        pNVar7 = t->node;
        uVar4 = uVar11 + 1;
      } while (pNVar7[uVar11].i_val.tt_ == 0);
      uVar2 = *(undefined8 *)((long)&pNVar7[uVar11].i_key + 8);
      key->value_ = pNVar7[uVar11].i_key.nk.value_;
      *(undefined8 *)&key->tt_ = uVar2;
      pNVar7 = t->node + uVar11;
      iVar5 = (pNVar7->i_val).tt_;
      uVar3 = *(undefined4 *)&(pNVar7->i_val).field_0xc;
      key[1].value_ = (pNVar7->i_val).value_;
      key[1].tt_ = iVar5;
      *(undefined4 *)&key[1].field_0xc = uVar3;
      return 1;
    }
    uVar12 = uVar12 + 1;
    lVar8 = lVar10 + 0x10;
  } while (*(int *)((long)&t->array->tt_ + lVar10) == 0);
  (key->value_).i = uVar12 & 0xffffffff;
  key->tt_ = 0x13;
  pVVar1 = (Value *)((long)&t->array->value_ + lVar10);
  VVar6 = pVVar1[1];
  key[1].value_ = *pVVar1;
  *(Value *)&key[1].tt_ = VVar6;
  return 1;
}

Assistant:

int luaH_next(lua_State *L, Table *t, StkId key) {
    unsigned int i = findindex(L, t, key);  /* find original element */
    for (; i < t->sizearray; i++) {  /* try first array part */
        if (!ttisnil(&t->array[i])) {  /* a non-nil value? */
            setivalue(key, i + 1);
            setobj2s(L, key + 1, &t->array[i]);
            return 1;
        }
    }
    for (i -= t->sizearray; cast_int(i) < sizenode(t); i++) {  /* hash part */
        if (!ttisnil(gval(gnode(t, i)))) {  /* a non-nil value? */
            setobj2s(L, key, gkey(gnode(t, i)));
            setobj2s(L, key + 1, gval(gnode(t, i)));
            return 1;
        }
    }
    return 0;  /* no more elements */
}